

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_pwd.c
# Opt level: O3

err_t cmdPwdReadShare_internal
                (cmd_pwd_t *pwd,size_t scount,size_t len,bool_t crc,char **shares,cmd_pwd_t spwd)

{
  err_t eVar1;
  bool_t bVar2;
  octet *poVar3;
  size_t pwd_len;
  char *dest;
  size_t share_len_00;
  ulong uVar4;
  size_t sVar5;
  err_t eVar6;
  long lVar7;
  octet *poVar8;
  size_t epki_len_max;
  bool_t local_94;
  size_t local_90;
  size_t epki_len;
  octet *local_80;
  cmd_pwd_t *local_78;
  octet *local_70;
  char **local_68;
  size_t epki_len_min;
  size_t local_58;
  octet *local_50;
  size_t local_48;
  size_t local_40;
  size_t share_len;
  
  *pwd = (cmd_pwd_t)0x0;
  local_94 = crc;
  local_90 = scount;
  local_78 = pwd;
  local_68 = shares;
  if (len == 0) {
    local_70 = (octet *)spwd;
    sVar5 = cmdFileSize(*shares);
    if (sVar5 == 0xffffffffffffffff) {
      eVar1 = 0xcf;
    }
    else {
      share_len_00 = 0x11;
      epki_len = sVar5;
      do {
        eVar1 = bpkiShareWrap((octet *)0x0,&epki_len_min,(octet *)0x0,share_len_00,(octet *)0x0,0,
                              (octet *)0x0,10000);
        if (eVar1 != 0) {
          return eVar1;
        }
        eVar1 = bpkiShareWrap((octet *)0x0,&epki_len_max,(octet *)0x0,share_len_00,(octet *)0x0,0,
                              (octet *)0x0,0xffffffffffffffff);
        if (eVar1 != 0) {
          return eVar1;
        }
        if (sVar5 <= epki_len_max && epki_len_min <= sVar5) {
          local_58 = share_len_00 - 1;
          spwd = (cmd_pwd_t)local_70;
          goto LAB_00105ad3;
        }
        uVar4 = share_len_00 - 1;
        share_len_00 = share_len_00 + 8;
      } while (uVar4 < 0x19);
      eVar1 = 0x132;
    }
  }
  else {
    share_len_00 = len + 1;
    eVar1 = bpkiShareWrap((octet *)0x0,&epki_len_min,(octet *)0x0,share_len_00,(octet *)0x0,0,
                          (octet *)0x0,10000);
    if ((eVar1 == 0) &&
       (local_58 = len,
       eVar1 = bpkiShareWrap((octet *)0x0,&epki_len_max,(octet *)0x0,share_len_00,(octet *)0x0,0,
                             (octet *)0x0,0xffffffffffffffff), eVar1 == 0)) {
LAB_00105ad3:
      sVar5 = local_90;
      lVar7 = share_len_00 * local_90;
      poVar3 = (octet *)blobCreate(epki_len_max + share_len_00 + lVar7);
      if (poVar3 == (octet *)0x0) {
        poVar3 = (octet *)*local_78;
      }
      else {
        poVar8 = poVar3 + lVar7;
        local_48 = epki_len_max;
        local_80 = poVar3;
        local_70 = (octet *)spwd;
        if (sVar5 != 0) {
          sVar5 = 0;
          local_50 = poVar3;
          do {
            eVar1 = cmdFileReadAll((void *)0x0,&epki_len,local_68[sVar5]);
            poVar3 = local_80;
            if ((((eVar1 != 0) || (eVar6 = 0x132, eVar1 = eVar6, epki_len < epki_len_min)) ||
                (epki_len_max < epki_len)) ||
               (eVar1 = cmdFileReadAll(poVar8,&epki_len,local_68[sVar5]), poVar3 = local_80,
               eVar1 != 0)) goto LAB_00105c2a;
            local_40 = epki_len;
            pwd_len = strLen(spwd);
            eVar1 = bpkiShareUnwrap(local_50,&share_len,poVar8,local_40,(octet *)spwd,pwd_len);
            poVar3 = local_80;
            if ((eVar1 != 0) || (eVar1 = eVar6, share_len != share_len_00)) goto LAB_00105c2a;
            sVar5 = sVar5 + 1;
            local_50 = local_50 + share_len_00;
          } while (local_90 != sVar5);
        }
        sVar5 = local_58;
        poVar3 = local_80;
        poVar8 = poVar8 + local_48 + 1;
        eVar1 = belsRecover2(poVar8,local_90,local_58,local_80);
        if (eVar1 != 0) {
LAB_00105c2a:
          blobClose(poVar3);
          return eVar1;
        }
        if (local_94 != 0) {
          beltMACStart(poVar3,poVar8,sVar5 - 8);
          beltMACStepA(poVar8,sVar5 - 8,poVar3);
          bVar2 = beltMACStepV(poVar8 + (sVar5 - 8),poVar3);
          if (bVar2 == 0) {
            blobClose(poVar3);
            return 0x200;
          }
        }
        dest = (char *)blobCreate(sVar5 * 2 + 1);
        *local_78 = dest;
        if (dest != (char *)0x0) {
          hexFrom(dest,poVar8,sVar5);
          blobClose(poVar3);
          return 0;
        }
      }
      blobClose(poVar3);
      eVar1 = 0x6e;
    }
  }
  return eVar1;
}

Assistant:

static err_t cmdPwdReadShare_internal(cmd_pwd_t* pwd, size_t scount,
	size_t len, bool_t crc, char* shares[], const cmd_pwd_t spwd)
{
	err_t code;
	size_t epki_len;
	size_t epki_len_min;
	size_t epki_len_max;
	void* stack;
	octet* share;
	octet* state;
	octet* epki;
	octet* pwd_bin;
	size_t pos;
	// pre
	ASSERT(memIsValid(pwd, sizeof(cmd_pwd_t)));
	ASSERT(cmdPwdIsValid(spwd));
	ASSERT(2 <= scount && scount <= 16);
	ASSERT(len % 8 == 0 && len <= 32);
	ASSERT(!crc || len != 16);
	// пароль пока не создан
	*pwd = 0;
	// определить длину частичного секрета
	if (len == 0)
	{
		// определить размер первого файла с частичным секретом
		if ((epki_len = cmdFileSize(shares[0])) == SIZE_MAX)
			return ERR_FILE_READ;
		// найти подходящую длину
		for (len = 16; len <= 32; len += 8)
		{
			code = bpkiShareWrap(0, &epki_len_min, 0, len + 1, 0, 0, 0, 10000);
			ERR_CALL_CHECK(code);
			code = bpkiShareWrap(0, &epki_len_max, 0, len + 1, 0, 0, 0, 
				SIZE_MAX);
			ERR_CALL_CHECK(code);
			if (epki_len_min <= epki_len && epki_len <= epki_len_max)
				break;
		}
		if (len > 32)
			return ERR_BAD_FORMAT;
	}
	else
	{
		code = bpkiShareWrap(0, &epki_len_min, 0, len + 1, 0, 0, 0, 10000);
		ERR_CALL_CHECK(code);
		code = bpkiShareWrap(0, &epki_len_max, 0, len + 1, 0, 0, 0,	SIZE_MAX);
		ERR_CALL_CHECK(code);
	}
	// выделить память и разметить ее
	code = cmdBlobCreate(stack, scount * (len + 1) + epki_len_max + 1 + len);
	ERR_CALL_HANDLE(code, cmdPwdClose(*pwd));
	share = state = (octet*)stack;
	epki = share + scount * (len + 1);
	pwd_bin = epki + epki_len_max + 1;
	// прочитать частичные секреты
	for (pos = 0; pos < scount; ++pos, ++shares)
	{
		size_t share_len;
		// определить длину контейнера
		code = cmdFileReadAll(0, &epki_len, *shares);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить длину
		code = (epki_len_min <= epki_len && epki_len <= epki_len_max) ?
			ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// читать
		code = cmdFileReadAll(epki, &epki_len, *shares);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// декодировать
		code = bpkiShareUnwrap(share + pos * (len + 1), &share_len,
			epki, epki_len, (const octet*)spwd, cmdPwdLen(spwd));
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		code = (share_len == len + 1) ? ERR_OK : ERR_BAD_FORMAT;
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	}
	// собрать пароль
	code = belsRecover2(pwd_bin, scount, len, share);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить пароль
	if (crc)
	{
		beltMACStart(state, pwd_bin, len - 8);
		beltMACStepA(pwd_bin, len - 8, state);
		if (!beltMACStepV(pwd_bin + len - 8, state))
			code = ERR_BAD_CRC;
	}
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// создать выходной (текстовый) пароль
	*pwd = cmdPwdCreate(2 * len);
	code = *pwd ? ERR_OK : ERR_OUTOFMEMORY;
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	hexFrom(*pwd, pwd_bin, len);
	cmdBlobClose(stack);
	return code;
}